

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<DataStream,std::vector<CCoin,std::allocator<CCoin>>>
          (VectorFormatter<DefaultFormatter> *this,DataStream *s,
          vector<CCoin,_std::allocator<CCoin>_> *v)

{
  pointer pCVar1;
  value_type *elem;
  pointer args_1;
  long in_FS_OFFSET;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<DataStream>
            (s,((long)(v->super__Vector_base<CCoin,_std::allocator<CCoin>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CCoin,_std::allocator<CCoin>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  args_1 = (v->super__Vector_base<CCoin,_std::allocator<CCoin>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pCVar1 = (v->super__Vector_base<CCoin,_std::allocator<CCoin>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (args_1 != pCVar1) {
    do {
      local_2c = 0;
      SerializeMany<DataStream,unsigned_int,unsigned_int,CTxOut>
                (s,&local_2c,&args_1->nHeight,&args_1->out);
      args_1 = args_1 + 1;
    } while (args_1 != pCVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }